

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_C2S_REQUEST_check(void)

{
  int32_t iVar1;
  uint8_t buf5 [2];
  uint8_t buf6 [3];
  uint8_t buf7 [10];
  uint8_t buf4 [19];
  uint8_t buf3 [19];
  uint8_t buf2 [19];
  uint8_t buf1 [19];
  PipeMsg msg;
  uint8_t local_1be [6];
  uint8_t local_1b8 [16];
  uint8_t local_1a8 [32];
  uint8_t local_188 [32];
  uint8_t local_168 [32];
  uint8_t local_148 [32];
  PipeMsg local_128;
  
  MsgHelper::initMsg(&local_128,C2S_REQUEST);
  local_148[0] = '\x01';
  local_148[1] = '\x01';
  local_148[2] = '\x03';
  local_148[3] = '\r';
  local_148[4] = 'w';
  local_148[5] = 'w';
  local_148[6] = 'w';
  local_148[7] = '.';
  local_148[8] = 'b';
  local_148[9] = 'a';
  local_148[10] = 'i';
  local_148[0xb] = 'd';
  local_148[0xc] = 'u';
  local_148[0xd] = '.';
  local_148[0xe] = 'c';
  local_148[0xf] = 'o';
  local_148[0x10] = 'm';
  local_148[0x11] = 0x8c;
  local_148[0x12] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_148,0x13,&local_128);
  if (iVar1 != 0x13) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x6d,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  local_168[0] = '\x01';
  local_168[1] = '\x01';
  local_168[2] = '\x03';
  local_168[3] = '\x0e';
  local_168[4] = 'w';
  local_168[5] = 'w';
  local_168[6] = 'w';
  local_168[7] = '.';
  local_168[8] = 'b';
  local_168[9] = 'a';
  local_168[10] = 'i';
  local_168[0xb] = 'd';
  local_168[0xc] = 'u';
  local_168[0xd] = '.';
  local_168[0xe] = 'c';
  local_168[0xf] = 'o';
  local_168[0x10] = 'm';
  local_168[0x11] = 0x8c;
  local_168[0x12] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_168,0x13,&local_128);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x77,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  local_188[0] = '\x01';
  local_188[1] = '\x01';
  local_188[2] = '\x03';
  local_188[3] = '\f';
  local_188[4] = 'w';
  local_188[5] = 'w';
  local_188[6] = 'w';
  local_188[7] = '.';
  local_188[8] = 'b';
  local_188[9] = 'a';
  local_188[10] = 'i';
  local_188[0xb] = 'd';
  local_188[0xc] = 'u';
  local_188[0xd] = '.';
  local_188[0xe] = 'c';
  local_188[0xf] = 'o';
  local_188[0x10] = 'm';
  local_188[0x11] = 0x8c;
  local_188[0x12] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_188,0x13,&local_128);
  if (iVar1 != 0x12) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x80,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  builtin_memcpy(local_1a8,"\x01\x01\x03",4);
  local_1a8[4] = 'w';
  local_1a8[5] = 'w';
  local_1a8[6] = 'w';
  local_1a8[7] = '.';
  local_1a8[8] = 'b';
  local_1a8[9] = 'a';
  local_1a8[10] = 'i';
  local_1a8[0xb] = 'd';
  local_1a8[0xc] = 'u';
  local_1a8[0xd] = '.';
  local_1a8[0xe] = 'c';
  local_1a8[0xf] = 'o';
  local_1a8[0x10] = 'm';
  local_1a8[0x11] = 0x8c;
  local_1a8[0x12] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_1a8,0x13,&local_128);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg(&local_128);
    local_1be[0] = '\x01';
    local_1be[1] = 0xdd;
    iVar1 = MsgHelper::deserializeMsg(local_1be,2,&local_128);
    if (iVar1 != -1) {
      __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                    ,0x8f,"void test_C2S_REQUEST_check()");
    }
    MsgHelper::destroyMsg(&local_128);
    local_1be[4] = 0xdd;
    local_1be[2] = '\x01';
    local_1be[3] = '\x01';
    iVar1 = MsgHelper::deserializeMsg(local_1be + 2,3,&local_128);
    if (iVar1 == -1) {
      MsgHelper::destroyMsg(&local_128);
      local_1b8[0] = '\x01';
      local_1b8[1] = '\x01';
      local_1b8[2] = '\x01';
      local_1b8[3] = '/';
      local_1b8[4] = 'K';
      local_1b8[5] = 0xda;
      local_1b8[6] = 200;
      local_1b8[7] = 0xff;
      local_1b8[8] = 0xf1;
      local_1b8[9] = 0xdd;
      iVar1 = MsgHelper::deserializeMsg(local_1b8,10,&local_128);
      if (iVar1 == 9) {
        MsgHelper::destroyMsg(&local_128);
        return;
      }
      __assert_fail("MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                    ,0x99,"void test_C2S_REQUEST_check()");
    }
    __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x94,"void test_C2S_REQUEST_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x8a,"void test_C2S_REQUEST_check()");
}

Assistant:

void test_C2S_REQUEST_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_REQUEST);
	
	const uint8_t buf1[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf2[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0E, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf3[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0C, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len (0x00)
	const uint8_t buf4[] = {
		0x01, 
		0x01, 
		0x03, 
		0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: cmd(0xdd) overflow
	const uint8_t buf5[] = {0x01, 0xdd,};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: atyp(0xdd) overflow
	const uint8_t buf6[] = {0x01,  0x01, 0xdd};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf7[] = {0x01, 0x01, 0x01, 0x2F, 0x4B, 0xDA, 0xC8, 0xFF, 0xF1, 0xDD};
	assert(MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9);
	MsgHelper::destroyMsg(&msg);
}